

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

int32 hash_table_lookup(hash_table_t *h,char *key,void **val)

{
  uint32 hash;
  int32 iVar1;
  size_t len;
  hash_entry_t *phVar2;
  
  hash = key2hash(h,key);
  len = strlen(key);
  phVar2 = lookup(h,hash,key,len);
  if (phVar2 == (hash_entry_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (val != (void **)0x0) {
      *val = phVar2->val;
    }
  }
  return iVar1;
}

Assistant:

int32
hash_table_lookup(hash_table_t * h, const char *key, void ** val)
{
    hash_entry_t *entry;
    uint32 hash;
    size_t len;

    hash = key2hash(h, key);
    len = strlen(key);

    entry = lookup(h, hash, key, len);
    if (entry) {
        if (val)
            *val = entry->val;
        return 0;
    }
    else
        return -1;
}